

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content_without_length(Stream *strm,ContentReceiver *out)

{
  bool bVar1;
  int iVar2;
  long *in_RDI;
  int n;
  char buf [4096];
  undefined4 in_stack_ffffffffffffefe0;
  char *in_stack_ffffffffffffefe8;
  function<bool_(const_char_*,_unsigned_long)> *in_stack_ffffffffffffeff0;
  
  while( true ) {
    iVar2 = (**(code **)(*in_RDI + 0x10))(in_RDI,&stack0xffffffffffffefe8,0x1000);
    if (iVar2 < 0) {
      return false;
    }
    if (iVar2 == 0) break;
    bVar1 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                      (in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,
                       CONCAT44(iVar2,in_stack_ffffffffffffefe0));
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

inline bool read_content_without_length(Stream &strm, ContentReceiver out) {
  char buf[CPPHTTPLIB_RECV_BUFSIZ];
  for (;;) {
    auto n = strm.read(buf, CPPHTTPLIB_RECV_BUFSIZ);
    if (n < 0) {
      return false;
    } else if (n == 0) {
      return true;
    }
    if (!out(buf, n)) { return false; }
  }

  return true;
}